

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

void bson_iter_timestamp(bson_iter_t *iter,uint32_t *timestamp,uint32_t *increment)

{
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t ret_increment;
  uint32_t ret_timestamp;
  uint64_t encoded;
  uint32_t *increment_local;
  uint32_t *timestamp_local;
  bson_iter_t *iter_local;
  
  local_2c = 0;
  local_30 = 0;
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x66d,"bson_iter_timestamp","iter");
    abort();
  }
  if (iter->raw[iter->type] == '\x11') {
    local_2c = (uint32_t)((ulong)*(undefined8 *)(iter->raw + iter->d1) >> 0x20);
    local_30 = (uint32_t)*(undefined8 *)(iter->raw + iter->d1);
  }
  if (timestamp != (uint32_t *)0x0) {
    *timestamp = local_2c;
  }
  if (increment != (uint32_t *)0x0) {
    *increment = local_30;
  }
  return;
}

Assistant:

void
bson_iter_timestamp (const bson_iter_t *iter, /* IN */
                     uint32_t *timestamp,     /* OUT */
                     uint32_t *increment)     /* OUT */
{
   uint64_t encoded;
   uint32_t ret_timestamp = 0;
   uint32_t ret_increment = 0;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_TIMESTAMP) {
      memcpy (&encoded, iter->raw + iter->d1, sizeof (encoded));
      encoded = BSON_UINT64_FROM_LE (encoded);
      ret_timestamp = (encoded >> 32) & 0xFFFFFFFF;
      ret_increment = encoded & 0xFFFFFFFF;
   }

   if (timestamp) {
      *timestamp = ret_timestamp;
   }

   if (increment) {
      *increment = ret_increment;
   }
}